

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void Catch::anon_unknown_1::renderTestProgress(int current_test,int total_tests,string *next_test)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string result;
  string local_100;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  clara::std::__cxx11::to_string(&local_40,current_test);
  std::operator+(&local_c0,"[",&local_40);
  std::operator+(&local_a0,&local_c0,"/");
  clara::std::__cxx11::to_string(&local_e0,total_tests);
  std::operator+(&local_80,&local_a0,&local_e0);
  std::operator+(&local_60,&local_80,"] (");
  clara::std::__cxx11::to_string
            (&local_100,(int)(((double)current_test / (double)total_tests) * 100.0));
  std::operator+(&local_140,&local_60,&local_100);
  std::operator+(&local_160,&local_140,"%): ");
  std::operator+(&result,&local_160,next_test);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_40);
  if (result._M_string_length < 0x50) {
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_160,'P' - (char)result._M_string_length);
    std::__cxx11::string::append((string *)&result);
    this = &local_160;
  }
  else {
    if (result._M_string_length == 0x50) goto LAB_001a5f8f;
    std::__cxx11::string::substr((ulong)&local_140,(ulong)&result);
    std::operator+(&local_160,&local_140,"...");
    std::__cxx11::string::operator=((string *)&result,(string *)&local_160);
    std::__cxx11::string::~string((string *)&local_160);
    this = &local_140;
  }
  std::__cxx11::string::~string((string *)this);
LAB_001a5f8f:
  poVar1 = std::operator<<((ostream *)&std::cout,"\r");
  std::operator<<(poVar1,(string *)&result);
  std::ostream::flush();
  std::__cxx11::string::~string((string *)&result);
  return;
}

Assistant:

void renderTestProgress(int current_test, int total_tests, std::string next_test) {
            double progress = (double) current_test / (double) total_tests;
            int render_width = 80;
            std::string result = "[" + std::to_string(current_test) + "/" + std::to_string(total_tests) + "] (" + std::to_string(int(progress * 100)) + "%): " + next_test;
            if (result.size() < render_width) {
                result += std::string(render_width - result.size(), ' ');
            } else if (result.size() > render_width) {
                result = result.substr(0, render_width - 3) + "...";
            }
            std::cout << "\r" << result;
            std::cout.flush();
        }